

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_base.cpp
# Opt level: O0

void __thiscall zmq::socket_base_t::~socket_base_t(socket_base_t *this)

{
  void *pvVar1;
  undefined8 *in_RDI;
  scoped_lock_t lock;
  bool in_stack_0000003f;
  socket_base_t *in_stack_00000040;
  mutex_t *in_stack_ffffffffffffffc8;
  own_t *in_stack_ffffffffffffffd0;
  mutex_t *in_stack_fffffffffffffff0;
  
  *in_RDI = &PTR__socket_base_t_002c77c0;
  in_RDI[0xad] = &DAT_002c7930;
  in_RDI[0xaf] = &PTR__socket_base_t_002c7950;
  in_RDI[0xb0] = &PTR__socket_base_t_002c7988;
  if (in_RDI[0xc4] != 0) {
    if ((long *)in_RDI[0xc4] != (long *)0x0) {
      (**(code **)(*(long *)in_RDI[0xc4] + 8))();
    }
    in_RDI[0xc4] = 0;
  }
  if (in_RDI[0xd5] != 0) {
    pvVar1 = (void *)in_RDI[0xd5];
    if (pvVar1 != (void *)0x0) {
      signaler_t::~signaler_t((signaler_t *)in_stack_fffffffffffffff0);
      operator_delete(pvVar1,0xc);
    }
    in_RDI[0xd5] = 0;
  }
  scoped_lock_t::scoped_lock_t((scoped_lock_t *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8)
  ;
  stop_monitor(in_stack_00000040,in_stack_0000003f);
  if (((*(byte *)((long)in_RDI + 0x61d) ^ 0xff) & 1) != 0) {
    in_stack_ffffffffffffffd0 = (own_t *)&stderr;
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","_destroyed",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/socket_base.cpp"
            ,0x12f);
    fflush((FILE *)(in_stack_ffffffffffffffd0->super_object_t)._vptr_object_t);
    zmq_abort((char *)0x1ff7d5);
  }
  scoped_lock_t::~scoped_lock_t((scoped_lock_t *)0x1ff7e7);
  mutex_t::~mutex_t(in_stack_fffffffffffffff0);
  std::__cxx11::string::~string((string *)(in_RDI + 0xd0));
  array_t<zmq::pipe_t,_3>::~array_t((array_t<zmq::pipe_t,_3> *)0x1ff81a);
  inprocs_t::~inprocs_t((inprocs_t *)0x1ff82b);
  std::
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<zmq::own_t_*,_zmq::pipe_t_*>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<zmq::own_t_*,_zmq::pipe_t_*>_>_>_>
  ::~multimap((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<zmq::own_t_*,_zmq::pipe_t_*>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<zmq::own_t_*,_zmq::pipe_t_*>_>_>_>
               *)0x1ff83c);
  mutex_t::~mutex_t(in_stack_fffffffffffffff0);
  i_pipe_events::~i_pipe_events((i_pipe_events *)(in_RDI + 0xb0));
  i_poll_events::~i_poll_events((i_poll_events *)(in_RDI + 0xaf));
  array_item_t<0>::~array_item_t((array_item_t<0> *)(in_RDI + 0xad));
  own_t::~own_t(in_stack_ffffffffffffffd0);
  return;
}

Assistant:

zmq::socket_base_t::~socket_base_t ()
{
    if (_mailbox)
        LIBZMQ_DELETE (_mailbox);

    if (_reaper_signaler)
        LIBZMQ_DELETE (_reaper_signaler);

    scoped_lock_t lock (_monitor_sync);
    stop_monitor ();

    zmq_assert (_destroyed);
}